

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingMesh::~IfcReinforcingMesh(IfcReinforcingMesh *this)

{
  ~IfcReinforcingMesh(this);
  operator_delete(this,0x208);
  return;
}

Assistant:

IfcReinforcingMesh() : Object("IfcReinforcingMesh") {}